

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

DecodePsbtRequestStruct * __thiscall
cfd::api::json::DecodePsbtRequest::ConvertToStruct
          (DecodePsbtRequestStruct *__return_storage_ptr__,DecodePsbtRequest *this)

{
  DecodePsbtRequestStruct::DecodePsbtRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->network);
  __return_storage_ptr__->has_detail = this->has_detail_;
  __return_storage_ptr__->has_simple = this->has_simple_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtRequestStruct DecodePsbtRequest::ConvertToStruct() const {  // NOLINT
  DecodePsbtRequestStruct result;
  result.psbt = psbt_;
  result.network = network_;
  result.has_detail = has_detail_;
  result.has_simple = has_simple_;
  result.ignore_items = ignore_items;
  return result;
}